

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O3

shared_ptr<duckdb::LogStorage,_true> __thiscall duckdb::LogManager::GetLogStorage(LogManager *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<duckdb::LogStorage,_true> sVar2;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = (mutex_type *)(in_RSI + 0x10);
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 0xd8);
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0xe0);
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  sVar2.internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::LogStorage,_true>)
         sVar2.internal.super___shared_ptr<duckdb::LogStorage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<LogStorage> LogManager::GetLogStorage() {
	unique_lock<mutex> lck(lock);
	return log_storage;
}